

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *hs,uint16_t *out_group_id)

{
  uint16_t uVar1;
  SSL *ssl;
  uint16_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  uint16_t uVar5;
  size_t sVar6;
  uint16_t *puVar7;
  uint16_t *puVar8;
  long lVar9;
  
  ssl = hs->ssl;
  if ((ssl->field_0xa4 & 1) == 0) {
    __assert_fail("ssl->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xd9,"bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *, uint16_t *)");
  }
  sVar6 = (hs->config->supported_group_list).size_;
  if (sVar6 == 0) {
    puVar7 = &kDefaultGroups;
    sVar6 = 3;
  }
  else {
    puVar7 = (hs->config->supported_group_list).data_;
  }
  puVar2 = (hs->peer_supported_group_list).data_;
  sVar3 = (hs->peer_supported_group_list).size_;
  puVar8 = puVar7;
  sVar4 = sVar3;
  if ((ssl->options & 0x400000) == 0) {
    puVar8 = puVar2;
    puVar2 = puVar7;
    sVar4 = sVar6;
    sVar6 = sVar3;
  }
  puVar7 = puVar8 + sVar6;
  do {
    if (puVar8 == puVar7) {
LAB_00133439:
      return puVar8 != puVar7;
    }
    uVar1 = *puVar8;
    for (lVar9 = 0; sVar4 * 2 != lVar9; lVar9 = lVar9 + 2) {
      if ((uVar1 == *(uint16_t *)((long)puVar2 + lVar9)) &&
         ((uVar5 = ssl_protocol_version(ssl), 0x303 < uVar5 ||
          ((uVar1 != 0x11ec && (uVar1 != 0x6399)))))) {
        *out_group_id = uVar1;
        goto LAB_00133439;
      }
    }
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

bool tls1_get_shared_group(SSL_HANDSHAKE *hs, uint16_t *out_group_id) {
  SSL *const ssl = hs->ssl;
  assert(ssl->server);

  // Clients are not required to send a supported_groups extension. In this
  // case, the server is free to pick any group it likes. See RFC 4492,
  // section 4, paragraph 3.
  //
  // However, in the interests of compatibility, we will skip ECDH if the
  // client didn't send an extension because we can't be sure that they'll
  // support our favoured group. Thus we do not special-case an emtpy
  // |peer_supported_group_list|.

  Span<const uint16_t> groups = tls1_get_grouplist(hs);
  Span<const uint16_t> pref, supp;
  if (ssl->options & SSL_OP_CIPHER_SERVER_PREFERENCE) {
    pref = groups;
    supp = hs->peer_supported_group_list;
  } else {
    pref = hs->peer_supported_group_list;
    supp = groups;
  }

  for (uint16_t pref_group : pref) {
    for (uint16_t supp_group : supp) {
      if (pref_group == supp_group &&
          // Post-quantum key agreements don't fit in the u8-length-prefixed
          // ECPoint field in TLS 1.2 and below.
          (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||
           !is_post_quantum_group(pref_group))) {
        *out_group_id = pref_group;
        return true;
      }
    }
  }

  return false;
}